

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFoodWeb_kry.c
# Opt level: O0

int func(N_Vector cc,N_Vector fval,void *user_data)

{
  double dVar1;
  double dVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  realtype *cxy_00;
  realtype *ratesxy;
  UserData data;
  sunindextype idxl;
  sunindextype idxr;
  sunindextype idyl;
  sunindextype idyu;
  sunindextype is;
  sunindextype jy;
  sunindextype jx;
  realtype dcxri;
  realtype dcxli;
  realtype dcyui;
  realtype dcyli;
  realtype *fxy;
  realtype *rxy;
  realtype *cxy;
  realtype dely;
  realtype delx;
  realtype yy;
  realtype xx;
  void *user_data_local;
  N_Vector fval_local;
  N_Vector cc_local;
  
  dVar1 = *(double *)((long)user_data + 0x438);
  dVar2 = *(double *)((long)user_data + 0x440);
  for (is = 0; is < 8; is = is + 1) {
    iVar4 = -0x30;
    if (is != 0) {
      iVar4 = 0x30;
    }
    iVar5 = -0x30;
    if (is != 7) {
      iVar5 = 0x30;
    }
    for (jy = 0; jy < 8; jy = jy + 1) {
      iVar6 = -6;
      if (jy != 0) {
        iVar6 = 6;
      }
      iVar7 = -6;
      if (jy != 7) {
        iVar7 = 6;
      }
      cxy_00 = (realtype *)(*(long *)((long)cc->content + 0x10) + (jy * 6 + is * 0x30) * 8);
      ratesxy = (realtype *)
                (*(long *)(**(long **)((long)user_data + 0x410) + 0x10) + (jy * 6 + is * 0x30) * 8);
      lVar3 = *(long *)((long)fval->content + 0x10);
      WebRate(dVar1 * (double)jy,dVar2 * (double)is,cxy_00,ratesxy,user_data);
      for (idyu = 0; idyu < 6; idyu = idyu + 1) {
        *(double *)(lVar3 + (jy * 6 + is * 0x30) * 8 + idyu * 8) =
             *(double *)(*(long *)((long)user_data + 0x420) + idyu * 8) *
             ((cxy_00[iVar5 + idyu] - cxy_00[idyu]) - (cxy_00[idyu] - cxy_00[idyu - iVar4])) +
             *(double *)(*(long *)((long)user_data + 0x418) + idyu * 8) *
             ((cxy_00[iVar7 + idyu] - cxy_00[idyu]) - (cxy_00[idyu] - cxy_00[idyu - iVar6])) +
             ratesxy[idyu];
      }
    }
  }
  return 0;
}

Assistant:

static int func(N_Vector cc, N_Vector fval, void *user_data)
{
  realtype xx, yy, delx, dely, *cxy, *rxy, *fxy, dcyli, dcyui, dcxli, dcxri;
  sunindextype jx, jy, is, idyu, idyl, idxr, idxl;
  UserData data;
  
  data = (UserData)user_data;
  delx = data->dx;
  dely = data->dy;
  
  /* Loop over all mesh points, evaluating rate array at each point*/
  for (jy = 0; jy < MY; jy++) {
    
    yy = dely*jy;

    /* Set lower/upper index shifts, special at boundaries. */
    idyl = (jy != 0   ) ? NSMX : -NSMX;
    idyu = (jy != MY-1) ? NSMX : -NSMX;
    
    for (jx = 0; jx < MX; jx++) {

      xx = delx*jx;

      /* Set left/right index shifts, special at boundaries. */
      idxl = (jx !=  0  ) ?  NUM_SPECIES : -NUM_SPECIES;
      idxr = (jx != MX-1) ?  NUM_SPECIES : -NUM_SPECIES;

      cxy = IJ_Vptr(cc,jx,jy);
      rxy = IJ_Vptr(data->rates,jx,jy);
      fxy = IJ_Vptr(fval,jx,jy);

      /* Get species interaction rate array at (xx,yy) */
      WebRate(xx, yy, cxy, rxy, user_data);
      
      for(is = 0; is < NUM_SPECIES; is++) {
        
        /* Differencing in x direction */
        dcyli = *(cxy+is) - *(cxy - idyl + is) ;
        dcyui = *(cxy + idyu + is) - *(cxy+is);
        
        /* Differencing in y direction */
        dcxli = *(cxy+is) - *(cxy - idxl + is);
        dcxri = *(cxy + idxr +is) - *(cxy+is);
        
        /* Compute the total rate value at (xx,yy) */
        fxy[is] = (coy)[is] * (dcyui - dcyli) +
          (cox)[is] * (dcxri - dcxli) + rxy[is];
        
      } /* end of is loop */
      
    } /* end of jx loop */
    
  } /* end of jy loop */

  return(0);
}